

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

bool __thiscall
trun::Process_Unix::SpawnAndLoop
          (Process_Unix *this,string *command,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,ProcessCallbackBase *callback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  long lVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int __errnum;
  int iVar6;
  _List_node_base *p_Var7;
  ILogger *pIVar8;
  char *pcVar9;
  ulong uVar10;
  char **__argv;
  char *apcStack_60 [2];
  string local_50;
  
  uVar10 = ((long)(((arguments->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl._M_node._M_size << 0x20) + 0x200000000) >> 0x1d) + 0xfU &
           0xfffffffffffffff0;
  lVar3 = -uVar10;
  __argv = (char **)((long)apcStack_60 + lVar3 + 8);
  pcVar9 = (command->_M_dataplus)._M_p;
  *(char **)((long)apcStack_60 + (8 - uVar10)) = pcVar9;
  p_Var7 = (arguments->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 == (_List_node_base *)arguments) {
    uVar10 = 1;
  }
  else {
    uVar10 = 1;
    do {
      __argv[uVar10] = (char *)p_Var7[1]._M_next;
      uVar10 = uVar10 + 1;
      p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)arguments);
    uVar10 = uVar10 & 0xffffffff;
  }
  __argv[uVar10] = (char *)0x0;
  *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cdbb;
  __errnum = posix_spawnp(&this->pid,pcVar9,(posix_spawn_file_actions_t *)&this->child_fd_actions,
                          (posix_spawnattr_t *)0x0,__argv,_environ);
  if (__errnum == 0) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce47;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Process_Unix","");
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce50;
    pIVar8 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce5f;
    gnilk::Log::Debug<char_const*>(pIVar8,"Spawn ok, entering monitoring loop");
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      uVar10 = local_50.field_2._M_allocated_capacity + 1;
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce74;
      operator_delete(_Var4._M_p,uVar10);
    }
    p_Var2 = *(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface;
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce7c;
    (*p_Var2)(callback);
    while( true ) {
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce84;
      bVar5 = IsFinished(this);
      if (bVar5) break;
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce93;
      ConsumePipes(this,callback);
    }
    do {
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cea0;
      iVar6 = ConsumePipes(this,callback);
    } while (0 < iVar6);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cebe;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Process_Unix","");
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cec7;
    pIVar8 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ced6;
    gnilk::Log::Debug<char_const*>(pIVar8,"Process loop finished");
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ceeb;
      operator_delete(_Var4._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[1];
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cef4;
    (*p_Var2)(callback);
    iVar6 = this->pipe_stdout[0];
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cefc;
    close(iVar6);
    iVar6 = this->pipe_stdout[1];
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cf04;
    close(iVar6);
    iVar6 = this->pipe_stderr[0];
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cf0c;
    close(iVar6);
    iVar6 = this->pipe_stderr[1];
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cf14;
    close(iVar6);
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cf1c;
    posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)&this->child_fd_actions);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cde1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Process_Unix","");
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cdea;
    pIVar8 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12cdf5;
    pcVar9 = strerror(__errnum);
    *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce0a;
    gnilk::Log::Error<char_const*,int,char*>(pIVar8,"spawn: %d, %s",__errnum,pcVar9);
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      *(undefined8 *)((long)apcStack_60 + lVar3) = 0x12ce23;
      operator_delete(_Var4._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __errnum == 0;
}

Assistant:

bool Process_Unix::SpawnAndLoop(std::string command, std::list<std::string> &arguments, ProcessCallbackBase *callback) {

	// construct param array
	int count = arguments.size();
	char **param = (char **)alloca(sizeof(char *) * (count + 2));
	int i = 0;
	// command is argv[0]
	param[i] = (char *)command.c_str();
	i++;
	for (auto it = arguments.begin(); it!=arguments.end(); it++) {
		param[i] = (char *)it->c_str();
		i++;
	}
	param[i] = NULL;

	int status = posix_spawnp(&pid, command.c_str(), &child_fd_actions, NULL, param, environ);
	if (status == 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Spawn ok, entering monitoring loop");
		callback->OnProcessStarted();
		while (!IsFinished()) {
			ConsumePipes(callback);
		}			
		// Consume what ever is left after the process exited, perhaps this is enough...
		while(ConsumePipes(callback)>0) {}


        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process loop finished");
		callback->OnProcessExit();

		ClosePipe(pipe_stdout);
		ClosePipe(pipe_stderr);
	} else {
        gnilk::Logger::GetLogger("Process_Unix")->Error("spawn: %d, %s", status, strerror(status));
		return false;
	}
	posix_spawn_file_actions_destroy(&child_fd_actions);
	return true;
}